

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

UGroup * re2::LookupGroup(StringPiece *name,UGroup *groups,int ngroups)

{
  bool bVar1;
  StringPiece local_38;
  int local_28;
  int local_24;
  int i;
  int ngroups_local;
  UGroup *groups_local;
  StringPiece *name_local;
  
  local_28 = 0;
  local_24 = ngroups;
  _i = groups;
  groups_local = (UGroup *)name;
  while( true ) {
    if (local_24 <= local_28) {
      return (UGroup *)0x0;
    }
    StringPiece::StringPiece(&local_38,_i[local_28].name);
    bVar1 = operator==(&local_38,(StringPiece *)groups_local);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return _i + local_28;
}

Assistant:

static const UGroup* LookupGroup(const StringPiece& name,
                                 const UGroup *groups, int ngroups) {
  // Simple name lookup.
  for (int i = 0; i < ngroups; i++)
    if (StringPiece(groups[i].name) == name)
      return &groups[i];
  return NULL;
}